

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O2

nh_bool find_role(nh_roles_info *ri,char *role_str,int *out_role)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)ri->num_roles;
  if (ri->num_roles < 1) {
    uVar3 = uVar2;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      return '\0';
    }
    iVar1 = strcmp(role_str,ri->rolenames_m[uVar2]);
    if ((iVar1 == 0) ||
       ((ri->rolenames_f[uVar2] != (char *)0x0 &&
        (iVar1 = strcmp(role_str,ri->rolenames_f[uVar2]), iVar1 == 0)))) break;
    uVar2 = uVar2 + 1;
  }
  *out_role = (int)uVar2;
  return '\x01';
}

Assistant:

static nh_bool find_role(const struct nh_roles_info *ri,
			 const char *role_str, int *out_role)
{
    int i;

    for (i = 0; i < ri->num_roles; i++) {
	if (!strcmp(role_str, ri->rolenames_m[i]) ||
	    (ri->rolenames_f[i] && !strcmp(role_str, ri->rolenames_f[i]))) {
	    *out_role = i;
	    return TRUE;
	}
    }
    return FALSE;
}